

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void UnpackBitVectorToFlatIndexList(ImBitVector *in,ImVector<int> *out)

{
  uint *puVar1;
  uint *puVar2;
  ImVector<unsigned_int> *in_RDI;
  ImU32 bit_n;
  ImU32 entries_32;
  ImU32 *it;
  ImU32 *it_end;
  ImU32 *it_begin;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar3;
  uint uVar4;
  uint *local_28;
  
  puVar1 = ImVector<unsigned_int>::begin(in_RDI);
  puVar2 = ImVector<unsigned_int>::end(in_RDI);
  for (local_28 = puVar1; local_28 < puVar2; local_28 = local_28 + 1) {
    uVar4 = *local_28;
    if (uVar4 != 0) {
      for (uVar3 = 0; uVar3 < 0x20; uVar3 = uVar3 + 1) {
        if ((uVar4 & 1 << ((byte)uVar3 & 0x1f)) != 0) {
          ImVector<int>::push_back
                    ((ImVector<int> *)CONCAT44(uVar4,uVar3),
                     (int *)CONCAT44((int)(((long)local_28 - (long)puVar1 >> 2) << 5) + uVar3,
                                     in_stack_ffffffffffffffc8));
        }
      }
    }
  }
  return;
}

Assistant:

static void UnpackBitVectorToFlatIndexList(const ImBitVector* in, ImVector<int>* out)
{
    IM_ASSERT(sizeof(in->Storage.Data[0]) == sizeof(int));
    const ImU32* it_begin = in->Storage.begin();
    const ImU32* it_end = in->Storage.end();
    for (const ImU32* it = it_begin; it < it_end; it++)
        if (ImU32 entries_32 = *it)
            for (ImU32 bit_n = 0; bit_n < 32; bit_n++)
                if (entries_32 & ((ImU32)1 << bit_n))
                    out->push_back((int)(((it - it_begin) << 5) + bit_n));
}